

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O1

char_t __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::get
          (input_stream_t<cfgfile::qstring_trait_t> *this)

{
  buf_t *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QArrayData *pQVar4;
  qsizetype qVar5;
  Data *pDVar6;
  size_t sVar7;
  position_t pVar8;
  char cVar9;
  bool bVar10;
  _Elt_pointer pQVar11;
  char_t ch;
  char_t local_2a;
  position_t local_28;
  qsizetype local_18;
  
  if ((((this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) && (cVar9 = QTextStream::atEnd(), cVar9 != '\0')) &&
     (this->m_buf_pos == (this->m_buf).d.size)) {
    return (char_t)L'\0';
  }
  uVar2 = this->m_line_number;
  uVar3 = this->m_column_number;
  local_28.m_line_number._0_4_ = (int)uVar2;
  local_28.m_column_number = uVar3;
  local_28.m_line_number._4_4_ = (int)((ulong)uVar2 >> 0x20);
  std::
  deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ::emplace_back<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>
            (&(this->m_prev_positions).c,&local_28);
  this->m_column_number = this->m_column_number + 1;
  local_2a.ucs = L'\0';
  pQVar11 = (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pQVar11 ==
      (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    if (this->m_buf_pos == 0x200) {
      QTextStream::read((longlong)&local_28);
      pbVar1 = &this->m_buf;
      pQVar4 = &((pbVar1->d).d)->super_QArrayData;
      pVar8.m_column_number = (pos_t)(pbVar1->d).d;
      pVar8.m_line_number = (pos_t)(pbVar1->d).ptr;
      (this->m_buf).d.d = (Data *)local_28.m_column_number;
      (this->m_buf).d.ptr = (char16_t *)local_28.m_line_number;
      qVar5 = (this->m_buf).d.size;
      (this->m_buf).d.size = local_18;
      local_28 = pVar8;
      local_18 = qVar5;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,8);
        }
      }
      this->m_stream_pos = this->m_stream_pos + (this->m_buf).d.size;
      this->m_buf_pos = 0;
    }
    pDVar6 = (this->m_buf).d.d;
    sVar7 = this->m_buf_pos;
    if ((pDVar6 == (Data *)0x0) ||
       (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData((longlong)&this->m_buf,(AllocationOption)(this->m_buf).d.size);
    }
    local_2a.ucs = (this->m_buf).d.ptr[sVar7];
    this->m_buf_pos = this->m_buf_pos + 1;
  }
  else {
    if (pQVar11 ==
        (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pQVar11 = (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x100;
    }
    local_2a.ucs = pQVar11[-1].ucs;
    std::deque<QChar,_std::allocator<QChar>_>::pop_back(&(this->m_returned_char).c);
  }
  bVar10 = is_new_line(this,&local_2a);
  if (bVar10) {
    this->m_line_number = this->m_line_number + 1;
    this->m_column_number = 1;
  }
  return (char_t)local_2a.ucs;
}

Assistant:

typename Trait::char_t get()
	{
		if( !at_end() )
		{
			m_prev_positions.push( { m_column_number, m_line_number } );

			m_column_number += 1;

			typename Trait::char_t ch( 0x00 );

			if( !m_returned_char.empty() )
			{
				ch = m_returned_char.top();

				m_returned_char.pop();

				if( is_new_line( ch ) )
				{
					m_line_number += 1;
					m_column_number = 1;
				}

				return ch;
			}

			if( m_buf_pos == c_buff_size )
			{
				Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
				m_buf_pos = 0;
			}

			ch = m_buf[ m_buf_pos ];

			++m_buf_pos;

			if( is_new_line( ch ) )
			{
				m_line_number += 1;
				m_column_number = 1;
			}

			return ch;
		}
		else
			return typename Trait::char_t( 0x00 );
	}